

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O0

bool __thiscall prometheus::detail::CurlWrapper::addHttpHeader(CurlWrapper *this,string *header)

{
  undefined8 uVar1;
  curl_slist *pcVar2;
  curl_slist *updated_header;
  lock_guard<std::mutex> lock;
  string *header_local;
  CurlWrapper *this_local;
  
  lock._M_device = (mutex_type *)header;
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&updated_header,&this->mutex_)
  ;
  pcVar2 = this->optHttpHeader_;
  uVar1 = ::std::__cxx11::string::c_str();
  pcVar2 = (curl_slist *)curl_slist_append(pcVar2,uVar1);
  if (pcVar2 != (curl_slist *)0x0) {
    this->optHttpHeader_ = pcVar2;
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&updated_header);
  return pcVar2 != (curl_slist *)0x0;
}

Assistant:

bool CurlWrapper::addHttpHeader(const std::string& header) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto updated_header = curl_slist_append(optHttpHeader_, header.c_str());
  if (!updated_header) {
    return false;
  }

  optHttpHeader_ = updated_header;
  return true;
}